

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSE.cpp
# Opt level: O3

void ac::core::cpu::conv3x3_1to8_sse(Image *src,Image *dst,float *kernels,float *biases)

{
  int iVar1;
  int scale;
  int w;
  int local_50;
  int local_4c;
  anon_class_32_5_78cfb1ca local_48;
  undefined1 local_28 [40];
  
  iVar1 = src->elementType;
  local_48.kernels = kernels;
  local_48.biases = biases;
  local_28._16_8_ = src;
  local_28._32_8_ = dst;
  if (iVar1 == 0x204) {
    local_48.w = src->w;
    iVar1 = src->pitch;
    local_48.step = iVar1 + 3;
    if (-1 < iVar1) {
      local_48.step = iVar1;
    }
    local_48.h = src->h;
    local_48.step = local_48.step >> 2;
    local_28._8_8_ = &local_48;
    local_4c = dst->w;
    local_28._0_8_ = &local_4c;
    local_50 = local_4c / local_48.w;
    local_28._24_8_ = &local_50;
    core::
    parallelFor<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_include_AC_Core_Util_hpp:114:9)>
              (0,dst->h,(anon_class_40_5_2c6a907a *)local_28);
  }
  else if (iVar1 == 2) {
    local_48.w = src->w;
    local_48.h = src->h;
    local_48.step = src->pitch / 2;
    local_28._8_8_ = &local_48;
    local_4c = dst->w;
    local_28._0_8_ = &local_4c;
    local_50 = local_4c / local_48.w;
    local_28._24_8_ = &local_50;
    core::
    parallelFor<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_include_AC_Core_Util_hpp:114:9)>
              (0,dst->h,(anon_class_40_5_2c6a907a *)local_28);
  }
  else if (iVar1 == 1) {
    local_48.w = src->w;
    local_48.h = src->h;
    local_48.step = src->pitch;
    local_28._8_8_ = &local_48;
    local_4c = dst->w;
    local_28._0_8_ = &local_4c;
    local_50 = local_4c / local_48.w;
    local_28._24_8_ = &local_50;
    core::
    parallelFor<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_include_AC_Core_Util_hpp:114:9)>
              (0,dst->h,(anon_class_40_5_2c6a907a *)local_28);
  }
  return;
}

Assistant:

void conv3x3_1to8_sse(const Image& src, Image& dst, const float* kernels, const float* biases)
    {
        switch (src.type())
        {
        case Image::UInt8:
            conv3x3_sse_cin1<std::uint8_t, float, 8>(src, dst, kernels, biases);
            break;
        case Image::UInt16:
            conv3x3_sse_cin1<std::uint16_t, float, 8>(src, dst, kernels, biases);
            break;
        case Image::Float32:
            conv3x3_sse_cin1<float, float, 8>(src, dst, kernels, biases);
            break;
        }
    }